

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O2

void __thiscall
re2::Prog::MarkDominator
          (Prog *this,int root,SparseArray<int> *rootmap,SparseArray<int> *predmap,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *predvec,SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  int i;
  int iVar1;
  pointer piVar2;
  Inst *pIVar3;
  pointer pvVar4;
  int *piVar5;
  bool bVar6;
  int *piVar7;
  int *piVar8;
  uint i_00;
  int root_local;
  int local_48;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_44;
  SparseArray<int> *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  uint32_t uVar9;
  
  reachable->size_ = 0;
  piVar2 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar2) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar2;
  }
  root_local = root;
  local_40 = predmap;
  local_38 = predvec;
  std::vector<int,_std::allocator<int>_>::push_back(stk,&root_local);
  do {
    piVar2 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start == piVar2) {
      piVar7 = (reachable->dense_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>
               ._M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      for (piVar8 = piVar7; piVar8 != piVar7 + reachable->size_; piVar8 = piVar8 + 1) {
        i = *piVar8;
        bVar6 = SparseArray<int>::has_index(local_40,i);
        if (bVar6) {
          iVar1 = (local_40->dense_).ptr_._M_t.
                  super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                  .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl
                  [(local_40->sparse_).ptr_._M_t.
                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[i]].value_;
          pvVar4 = (local_38->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar5 = *(pointer *)
                    ((long)&pvVar4[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data + 8);
          for (piVar7 = pvVar4[iVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; piVar7 != piVar5; piVar7 = piVar7 + 1) {
            bVar6 = SparseSetT<void>::contains(reachable,*piVar7);
            if (!bVar6) {
              bVar6 = SparseArray<int>::has_index(rootmap,i);
              if (!bVar6) {
                local_48 = rootmap->size_;
                SparseArray<int>::set_new(rootmap,i,&local_48);
              }
            }
          }
        }
        piVar7 = (reachable->dense_).ptr_._M_t.
                 super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
      }
      return;
    }
    i_00 = piVar2[-1];
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar2 + -1;
    while( true ) {
      bVar6 = SparseSetT<void>::contains(reachable,i_00);
      if (bVar6) break;
      SparseSetT<void>::insert_new(reachable,i_00);
      if (i_00 != root_local) {
        bVar6 = SparseArray<int>::has_index(rootmap,i_00);
        if (bVar6) break;
      }
      pIVar3 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      uVar9 = pIVar3[(int)i_00].out_opcode_;
      if ((3U >> (uVar9 & 7) & 1) == 0) {
        if ((uVar9 & 7) != 6) break;
      }
      else {
        local_44 = pIVar3[(int)i_00].field_1;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(stk,&local_44.cap_);
        uVar9 = pIVar3[(int)i_00].out_opcode_;
      }
      i_00 = uVar9 >> 4;
    }
  } while( true );
}

Assistant:

void Prog::MarkDominator(int root, SparseArray<int>* rootmap,
                         SparseArray<int>* predmap,
                         std::vector<std::vector<int>>* predvec,
                         SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition.
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }

  for (SparseSet::const_iterator i = reachable->begin();
       i != reachable->end();
       ++i) {
    int id = *i;
    if (predmap->has_index(id)) {
      for (int pred : (*predvec)[predmap->get_existing(id)]) {
        if (!reachable->contains(pred)) {
          // id has a predecessor that cannot be reached from root!
          // Therefore, id must be a "root" too - mark it as such.
          if (!rootmap->has_index(id))
            rootmap->set_new(id, rootmap->size());
        }
      }
    }
  }
}